

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_calendar_records.c
# Opt level: O0

greatest_test_res calendar_record_compare(void)

{
  int iVar1;
  greatest_test_res gVar2;
  undefined1 local_15c [8];
  calendar_record_t c;
  calendar_record_t b;
  calendar_record_t a;
  
  memcpy(b.end_date + 3,"SOME_ID1",0x70);
  memcpy(c.end_date + 3,"SOME_ID1",0x70);
  memcpy(local_15c,"SOME_ID1",0x70);
  greatest_info.assertions = greatest_info.assertions + 1;
  iVar1 = equal_calendar_record
                    ((calendar_record_t *)(b.end_date + 3),(calendar_record_t *)(c.end_date + 3));
  if (iVar1 == 1) {
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_calendar_record
                      ((calendar_record_t *)(b.end_date + 3),(calendar_record_t *)local_15c);
    if (iVar1 == 0) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_calendar_record
                        ((calendar_record_t *)(c.end_date + 3),(calendar_record_t *)local_15c);
      if (iVar1 == 0) {
        greatest_info.msg = (char *)0x0;
        a.end_date[3] = '\0';
        a.end_date[4] = '\0';
        a.end_date[5] = '\0';
        a.end_date[6] = '\0';
      }
      else {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_calendar_records.c"
        ;
        greatest_info.fail_line = 0x4d;
        greatest_info.msg = "0 != equal_calendar_record(&b, &c)";
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        a.end_date[3] = -1;
        a.end_date[4] = -1;
        a.end_date[5] = -1;
        a.end_date[6] = -1;
      }
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_calendar_records.c"
      ;
      greatest_info.fail_line = 0x4c;
      greatest_info.msg = "0 != equal_calendar_record(&a, &c)";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      a.end_date[3] = -1;
      a.end_date[4] = -1;
      a.end_date[5] = -1;
      a.end_date[6] = -1;
    }
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_calendar_records.c"
    ;
    greatest_info.fail_line = 0x4b;
    greatest_info.msg = "1 != equal_calendar_record(&a, &b)";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    a.end_date[3] = -1;
    a.end_date[4] = -1;
    a.end_date[5] = -1;
    a.end_date[6] = -1;
  }
  gVar2._0_1_ = a.end_date[3];
  gVar2._1_1_ = a.end_date[4];
  gVar2._2_1_ = a.end_date[5];
  gVar2._3_1_ = a.end_date[6];
  return gVar2;
}

Assistant:

TEST calendar_record_compare(void) {
    calendar_record_t a = {
        .service_id = "SOME_ID1",
        .start_date = "01012019",
        .end_date = "",
        .monday = SA_AVAILABLE,
        .tuesday = SA_AVAILABLE,
        .wednesday = SA_UNAVAILABLE,
        .thursday = SA_AVAILABLE,
        .friday = SA_NOT_SET,
        .saturday = SA_UNAVAILABLE,
        .sunday = SA_AVAILABLE
    };

    calendar_record_t b = {
        .service_id = "SOME_ID1",
        .start_date = "01012019",
        .end_date = "",
        .monday = SA_AVAILABLE,
        .tuesday = SA_AVAILABLE,
        .wednesday = SA_UNAVAILABLE,
        .thursday = SA_AVAILABLE,
        .friday = SA_NOT_SET,
        .saturday = SA_UNAVAILABLE,
        .sunday = SA_AVAILABLE
    };

    calendar_record_t c = {
        .service_id = "SOME_ID1",
        .start_date = "01012019",
        .end_date = "aa",
        .monday = SA_AVAILABLE,
        .tuesday = SA_AVAILABLE,
        .wednesday = SA_UNAVAILABLE,
        .thursday = SA_AVAILABLE,
        .friday = SA_NOT_SET,
        .saturday = SA_UNAVAILABLE,
        .sunday = SA_AVAILABLE
    };

    ASSERT_EQ(1, equal_calendar_record(&a, &b));
    ASSERT_EQ(0, equal_calendar_record(&a, &c));
    ASSERT_EQ(0, equal_calendar_record(&b, &c));

    PASS();
}